

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void cdef_row_mt_sync_write(AV1CdefSync *cdef_sync,int row)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  AV1CdefRowSync *cdef_row_mt;
  
  lVar1 = *(long *)(in_RDI + 8);
  pthread_mutex_lock(*(pthread_mutex_t **)(lVar1 + (long)in_ESI * 0x18));
  pthread_cond_signal(*(pthread_cond_t **)(lVar1 + (long)in_ESI * 0x18 + 8));
  *(undefined4 *)(lVar1 + (long)in_ESI * 0x18 + 0x10) = 1;
  pthread_mutex_unlock(*(pthread_mutex_t **)(lVar1 + (long)in_ESI * 0x18));
  return;
}

Assistant:

static inline void cdef_row_mt_sync_write(AV1CdefSync *const cdef_sync,
                                          int row) {
#if CONFIG_MULTITHREAD
  AV1CdefRowSync *const cdef_row_mt = cdef_sync->cdef_row_mt;
  pthread_mutex_lock(cdef_row_mt[row].row_mutex_);
  pthread_cond_signal(cdef_row_mt[row].row_cond_);
  cdef_row_mt[row].is_row_done = 1;
  pthread_mutex_unlock(cdef_row_mt[row].row_mutex_);
#else
  (void)cdef_sync;
  (void)row;
#endif  // CONFIG_MULTITHREAD
}